

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::require_texture_query_variant(CompilerHLSL *this,uint32_t var_id)

{
  BaseType BVar1;
  uint32_t id;
  ImageFormatNormalizedState IVar2;
  uint uVar3;
  CompilerError *pCVar4;
  SPIRType *pSVar5;
  ulong uVar6;
  byte bVar7;
  TextureSizeVariants *local_90;
  bool local_61;
  uint64_t mask;
  uint64_t *variant;
  ImageFormatNormalizedState norm_state;
  ID local_30;
  uint32_t bit;
  SPIRType *pSStack_28;
  bool uav;
  SPIRType *type;
  SPIRVariable *var;
  CompilerHLSL *pCStack_10;
  uint32_t var_id_local;
  CompilerHLSL *this_local;
  
  var._4_4_ = var_id;
  pCStack_10 = this;
  type = (SPIRType *)Compiler::maybe_get_backing_variable((Compiler *)this,var_id);
  if (type != (SPIRType *)0x0) {
    var._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  }
  pSStack_28 = Compiler::expression_type((Compiler *)this,var._4_4_);
  bit._3_1_ = (pSStack_28->image).sampled == 2;
  local_61 = false;
  if (((this->hlsl_options).nonwritable_uav_texture_as_srv & 1U) != 0) {
    TypedID<(spirv_cross::Types)0>::TypedID(&local_30,var._4_4_);
    local_61 = Compiler::has_decoration((Compiler *)this,local_30,DecorationNonWritable);
  }
  if (local_61 != false) {
    bit._3_1_ = 0;
  }
  switch((pSStack_28->image).dim) {
  case Dim1D:
    bVar7 = ((pSStack_28->image).arrayed & 1U) != 0;
    break;
  case Dim2D:
    if (((pSStack_28->image).ms & 1U) == 0) {
      bVar7 = 2;
      if (((pSStack_28->image).arrayed & 1U) != 0) {
        bVar7 = 3;
      }
    }
    else {
      bVar7 = 8;
      if (((pSStack_28->image).arrayed & 1U) != 0) {
        bVar7 = 9;
      }
    }
    break;
  case Dim3D:
    bVar7 = 4;
    break;
  case Cube:
    bVar7 = 6;
    if (((pSStack_28->image).arrayed & 1U) != 0) {
      bVar7 = 7;
    }
    break;
  default:
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar4,"Unsupported query type.");
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case Buffer:
    bVar7 = 5;
  }
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_28->image);
  pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
  BVar1 = pSVar5->basetype;
  if (BVar1 == Int) {
    bVar7 = bVar7 + 0x10;
  }
  else if (BVar1 == UInt) {
    bVar7 = bVar7 + 0x20;
  }
  else if (BVar1 != Float) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar4,"Unsupported query type.");
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  IVar2 = image_format_to_normalized_state((pSStack_28->image).format);
  if ((bit._3_1_ & 1) == 0) {
    local_90 = &this->required_texture_size_variants;
  }
  else {
    uVar3 = image_format_to_components((pSStack_28->image).format);
    local_90 = (TextureSizeVariants *)
               ((this->required_texture_size_variants).uav[IVar2] + (uVar3 - 1));
  }
  uVar6 = 1L << (bVar7 & 0x3f);
  if ((local_90->srv & uVar6) == 0) {
    Compiler::force_recompile((Compiler *)this);
    local_90->srv = uVar6 | local_90->srv;
  }
  return;
}

Assistant:

void CompilerHLSL::require_texture_query_variant(uint32_t var_id)
{
	if (const auto *var = maybe_get_backing_variable(var_id))
		var_id = var->self;

	auto &type = expression_type(var_id);
	bool uav = type.image.sampled == 2;
	if (hlsl_options.nonwritable_uav_texture_as_srv && has_decoration(var_id, DecorationNonWritable))
		uav = false;

	uint32_t bit = 0;
	switch (type.image.dim)
	{
	case Dim1D:
		bit = type.image.arrayed ? Query1DArray : Query1D;
		break;

	case Dim2D:
		if (type.image.ms)
			bit = type.image.arrayed ? Query2DMSArray : Query2DMS;
		else
			bit = type.image.arrayed ? Query2DArray : Query2D;
		break;

	case Dim3D:
		bit = Query3D;
		break;

	case DimCube:
		bit = type.image.arrayed ? QueryCubeArray : QueryCube;
		break;

	case DimBuffer:
		bit = QueryBuffer;
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported query type.");
	}

	switch (get<SPIRType>(type.image.type).basetype)
	{
	case SPIRType::Float:
		bit += QueryTypeFloat;
		break;

	case SPIRType::Int:
		bit += QueryTypeInt;
		break;

	case SPIRType::UInt:
		bit += QueryTypeUInt;
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported query type.");
	}

	auto norm_state = image_format_to_normalized_state(type.image.format);
	auto &variant = uav ? required_texture_size_variants
	                          .uav[uint32_t(norm_state)][image_format_to_components(type.image.format) - 1] :
	                      required_texture_size_variants.srv;

	uint64_t mask = 1ull << bit;
	if ((variant & mask) == 0)
	{
		force_recompile();
		variant |= mask;
	}
}